

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pac.c
# Opt level: O3

_Bool duckdb_je_pac_retain_grow_limit_get_set
                (tsdn_t *tsdn,pac_t *pac,size_t *old_limit,size_t *new_limit)

{
  pthread_mutex_t *__mutex;
  uint64_t *puVar1;
  witness_t **ppwVar2;
  ulong uVar3;
  long lVar4;
  int iVar5;
  byte bVar6;
  uint uVar7;
  
  if (new_limit == (size_t *)0x0) {
    uVar7 = 0;
  }
  else {
    uVar3 = *new_limit;
    if (uVar3 + 1 < 0x7000000000000001) {
      if (uVar3 == 0) {
        uVar7 = 0x40;
      }
      else {
        lVar4 = 0x3f;
        if (uVar3 != 0) {
          for (; uVar3 >> lVar4 == 0; lVar4 = lVar4 + -1) {
          }
        }
        uVar7 = (uint)lVar4 ^ 0x3f;
      }
      iVar5 = 0x32 - uVar7;
      if (0x32 < uVar7) {
        iVar5 = 0;
      }
      bVar6 = 0xc;
      if (0x3fff < uVar3) {
        bVar6 = (char)iVar5 + 0xb;
      }
      uVar7 = (((uint)(uVar3 >> (bVar6 & 0x3f)) & 3) + iVar5 * 4) - 1;
      if (0xc6 < uVar7) {
        return true;
      }
    }
    else {
      uVar7 = 0xc6;
    }
  }
  __mutex = (pthread_mutex_t *)((long)&(pac->grow_mtx).field_0 + 0x48);
  iVar5 = pthread_mutex_trylock(__mutex);
  if (iVar5 != 0) {
    duckdb_je_malloc_mutex_lock_slow(&pac->grow_mtx);
    (pac->grow_mtx).field_0.field_0.locked.repr = true;
  }
  puVar1 = &(pac->grow_mtx).field_0.field_0.prof_data.n_lock_ops;
  *puVar1 = *puVar1 + 1;
  if ((pac->grow_mtx).field_0.field_0.prof_data.prev_owner != tsdn) {
    (pac->grow_mtx).field_0.field_0.prof_data.prev_owner = tsdn;
    ppwVar2 = &(pac->grow_mtx).field_0.witness.link.qre_prev;
    *ppwVar2 = (witness_t *)((long)&(*ppwVar2)->name + 1);
  }
  if (old_limit != (size_t *)0x0) {
    *old_limit = duckdb_je_sz_pind2sz_tab[(pac->exp_grow).limit];
  }
  if (new_limit != (size_t *)0x0) {
    (pac->exp_grow).limit = uVar7;
  }
  (pac->grow_mtx).field_0.field_0.locked.repr = false;
  pthread_mutex_unlock(__mutex);
  return false;
}

Assistant:

bool
pac_retain_grow_limit_get_set(tsdn_t *tsdn, pac_t *pac, size_t *old_limit,
    size_t *new_limit) {
	pszind_t new_ind JEMALLOC_CC_SILENCE_INIT(0);
	if (new_limit != NULL) {
		size_t limit = *new_limit;
		/* Grow no more than the new limit. */
		if ((new_ind = sz_psz2ind(limit + 1) - 1) >= SC_NPSIZES) {
			return true;
		}
	}

	malloc_mutex_lock(tsdn, &pac->grow_mtx);
	if (old_limit != NULL) {
		*old_limit = sz_pind2sz(pac->exp_grow.limit);
	}
	if (new_limit != NULL) {
		pac->exp_grow.limit = new_ind;
	}
	malloc_mutex_unlock(tsdn, &pac->grow_mtx);

	return false;
}